

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O3

void ipc_dialer_dial(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  int iVar2;
  nng_err result;
  size_t sVar3;
  int *piVar4;
  undefined1 local_b8 [8];
  sockaddr_storage ss;
  nni_ipc_conn *c;
  
  nni_aio_reset(aio);
  sVar3 = nni_posix_nn2sockaddr(local_b8,(nni_sockaddr *)((long)arg + 0x88));
  if ((sVar3 == 0) || (local_b8._0_2_ != 1)) {
    result = NNG_EADDRINVAL;
    goto LAB_00133282;
  }
  iVar2 = socket(1,0x80001,0);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    result = nni_plat_errno(*piVar4);
    goto LAB_00133282;
  }
  result = nni_posix_ipc_alloc((nni_ipc_conn **)&ss.__ss_align,(nni_sockaddr *)((long)arg + 0x88),
                               (nni_ipc_dialer *)arg,iVar2);
  if (result != NNG_OK) {
    close(iVar2);
    goto LAB_00133282;
  }
  nni_refcnt_hold((nni_refcnt *)((long)arg + 0x110));
  mtx = (nni_mtx *)((long)arg + 0x60);
  nni_mtx_lock(mtx);
  _Var1 = nni_aio_start(aio,ipc_dialer_cancel,arg);
  if (!_Var1) {
    nni_mtx_unlock(mtx);
    nng_stream_free((nng_stream *)ss.__ss_align);
    return;
  }
  result = NNG_ECLOSED;
  if (*(char *)((long)arg + 0x58) == '\0') {
    *(nni_aio **)(ss.__ss_align + 0xd0) = aio;
    if (*(char *)((long)arg + 0x128) == '\x01') {
      piVar4 = __errno_location();
      *piVar4 = 0x73;
LAB_001332f7:
      result = nni_posix_pfd_arm((nni_posix_pfd *)(ss.__ss_align + 0x38),4);
      if (result == NNG_OK) {
        *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
        nni_aio_set_prov_data(aio,(void *)ss.__ss_align);
        nni_list_append((nni_list *)((long)arg + 0x40),aio);
        nni_mtx_unlock(mtx);
        return;
      }
    }
    else {
      iVar2 = connect(iVar2,(sockaddr *)local_b8,(socklen_t)sVar3);
      if (iVar2 == 0) {
        *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
        nni_aio_set_prov_data(aio,(void *)0x0);
        nni_mtx_unlock(mtx);
        nni_aio_set_output(aio,0,(void *)ss.__ss_align);
        nni_aio_finish(aio,NNG_OK,0);
        return;
      }
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (iVar2 == 2) {
        result = NNG_ECONNREFUSED;
      }
      else {
        if ((iVar2 == 0xb) || (iVar2 == 0x73)) goto LAB_001332f7;
        result = nni_plat_errno(iVar2);
      }
    }
  }
  *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
  nni_aio_set_prov_data(aio,(void *)0x0);
  nni_mtx_unlock(mtx);
  nng_stream_stop((nng_stream *)ss.__ss_align);
  nng_stream_free((nng_stream *)ss.__ss_align);
LAB_00133282:
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

void
ipc_dialer_dial(void *arg, nni_aio *aio)
{
	ipc_dialer             *d = arg;
	nni_ipc_conn           *c;
	struct sockaddr_storage ss;
	size_t                  len;
	int                     fd;
	int                     rv;

	nni_aio_reset(aio);

	if (((len = nni_posix_nn2sockaddr(&ss, &d->sa)) == 0) ||
	    (ss.ss_family != AF_UNIX)) {
		nni_aio_finish_error(aio, NNG_EADDRINVAL);
		return;
	}

	if ((fd = socket(ss.ss_family, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		nni_aio_finish_error(aio, nni_plat_errno(errno));
		return;
	}

	if ((rv = nni_posix_ipc_alloc(&c, &d->sa, d, fd)) != 0) {
		(void) close(fd);
		nni_aio_finish_error(aio, rv);
		return;
	}

	// hold for the conn
	nni_refcnt_hold(&d->ref);

	nni_mtx_lock(&d->mtx);
	if (!nni_aio_start(aio, ipc_dialer_cancel, d)) {
		nni_mtx_unlock(&d->mtx);
		nng_stream_free(&c->stream);
		return;
	}

	if (d->closed) {
		rv = NNG_ECLOSED;
		goto error;
	}
	c->dial_aio = aio;
#ifdef NNG_TEST_LIB
	// this stanza exists for testing, because IPC doesn't normally
	// exhibit a delayed connection.  But it could, and we need to try
	// to test it as much as possible.
	if (d->no_connect) {
		errno = EINPROGRESS;
	}
	if (d->no_connect || (connect(fd, (void *) &ss, len) != 0))
#else
	if (connect(fd, (void *) &ss, len) != 0)
#endif

	{
		if (errno != EINPROGRESS && errno != EAGAIN) {
			if (errno == ENOENT) {
				// No socket present means nobody listening.
				rv = NNG_ECONNREFUSED;
			} else {
				rv = nni_plat_errno(errno);
			}
			goto error;
		}
		// Asynchronous connect.
		if ((rv = nni_posix_pfd_arm(&c->pfd, NNI_POLL_OUT)) != 0) {
			goto error;
		}
		c->dial_aio = NULL;
		nni_aio_set_prov_data(aio, c);
		nni_list_append(&d->connq, aio);
		nni_mtx_unlock(&d->mtx);
		return;
	}
	// Immediate connect, cool! For IPC this is typical.
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);
	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
	return;

error:
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);
	nng_stream_stop(&c->stream);
	nng_stream_free(&c->stream);
	nni_aio_finish_error(aio, rv);
}